

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O2

void __thiscall depspawn::internal::ThreadPool::~ThreadPool(ThreadPool *this)

{
  pointer ptVar1;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  void *in_RSI;
  thread *thread;
  pointer ptVar2;
  
  wait(this,in_RSI);
  this->finish_ = true;
  launch_theads(this);
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::_Function_base::~_Function_base(&(this->func_).super__Function_base);
  std::condition_variable::~condition_variable(&this->cond_var_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~ThreadPool()
  {
    wait();
    
    finish_ = true;
    launch_theads();
    for (auto& thread : threads_) {
      thread.join();
    }
  }